

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O1

int clickhouse::SocketConnect
              (NetworkAddress *addr,optional<clickhouse::SocketTimeoutParams> *socket_timeout_params
              )

{
  int iVar1;
  int iVar2;
  int *piVar3;
  system_error *this;
  error_category *peVar4;
  int iVar5;
  int unaff_EBP;
  addrinfo *paVar6;
  bool bVar7;
  bool bVar8;
  int err;
  socklen_t len;
  pollfd fd;
  int local_64;
  int local_60 [2];
  pollfd local_58;
  __suseconds_t _Stack_50;
  __time_t local_48;
  __suseconds_t _Stack_40;
  
  paVar6 = addr->info_;
  bVar7 = paVar6 == (addrinfo *)0x0;
  if (bVar7) {
    local_64 = 0;
  }
  else {
    local_64 = 0;
    do {
      iVar1 = socket(paVar6->ai_family,paVar6->ai_socktype,paVar6->ai_protocol);
      if (iVar1 == -1) {
        bVar8 = false;
      }
      else {
        anon_unknown_4::SetNonBlock(iVar1,true);
        if ((socket_timeout_params->
            super__Optional_base<clickhouse::SocketTimeoutParams,_true,_true>)._M_payload.
            super__Optional_payload_base<clickhouse::SocketTimeoutParams>._M_engaged == true) {
          local_58 = (pollfd)(socket_timeout_params->
                             super__Optional_base<clickhouse::SocketTimeoutParams,_true,_true>).
                             _M_payload.
                             super__Optional_payload_base<clickhouse::SocketTimeoutParams>.
                             _M_payload._M_value.recv_timeout_.tv_sec;
          _Stack_50 = (socket_timeout_params->
                      super__Optional_base<clickhouse::SocketTimeoutParams,_true,_true>)._M_payload.
                      super__Optional_payload_base<clickhouse::SocketTimeoutParams>._M_payload.
                      _M_value.recv_timeout_.tv_usec;
          local_48 = (socket_timeout_params->
                     super__Optional_base<clickhouse::SocketTimeoutParams,_true,_true>)._M_payload.
                     super__Optional_payload_base<clickhouse::SocketTimeoutParams>._M_payload.
                     _M_value.send_timeout_.tv_sec;
          _Stack_40 = (socket_timeout_params->
                      super__Optional_base<clickhouse::SocketTimeoutParams,_true,_true>)._M_payload.
                      super__Optional_payload_base<clickhouse::SocketTimeoutParams>._M_payload.
                      _M_value.send_timeout_.tv_usec;
          iVar2 = setsockopt(iVar1,1,0x14,&local_58,0x10);
          if (iVar2 < 0) {
            this = (system_error *)__cxa_allocate_exception(0x20);
            piVar3 = __errno_location();
            iVar1 = *piVar3;
            peVar4 = (error_category *)std::_V2::system_category();
            std::system_error::system_error(this,iVar1,peVar4,"failed to setsockopt(SO_RCVTIMEO)");
            goto LAB_00134691;
          }
          iVar2 = setsockopt(iVar1,1,0x15,&local_48,0x10);
          if (iVar2 < 0) {
            this = (system_error *)__cxa_allocate_exception(0x20);
            piVar3 = __errno_location();
            iVar1 = *piVar3;
            peVar4 = (error_category *)std::_V2::system_category();
            std::system_error::system_error(this,iVar1,peVar4,"failed to setsockopt(SO_SNDTIMEO)");
            goto LAB_00134691;
          }
        }
        iVar2 = connect(iVar1,(sockaddr *)paVar6->ai_addr,paVar6->ai_addrlen);
        if (iVar2 == 0) {
          anon_unknown_4::SetNonBlock(iVar1,false);
          bVar8 = true;
          unaff_EBP = iVar1;
        }
        else {
          piVar3 = __errno_location();
          local_60[0] = *piVar3;
          if ((local_60[0] == 0x73) || (bVar8 = false, local_60[0] == 0xb)) {
            local_58.events = 4;
            local_58.revents = 0;
            local_58.fd = iVar1;
            iVar2 = poll(&local_58,1,5000);
            if (iVar2 == -1) {
              this = (system_error *)__cxa_allocate_exception(0x20);
              iVar1 = *piVar3;
              peVar4 = (error_category *)std::_V2::system_category();
              std::system_error::system_error(this,iVar1,peVar4,"fail to connect");
              goto LAB_00134691;
            }
            if (iVar2 < 1) {
              bVar8 = false;
            }
            else {
              local_60[1] = 4;
              getsockopt(iVar1,1,4,local_60,(socklen_t *)(local_60 + 1));
              iVar2 = local_60[0];
              iVar5 = local_60[0];
              if (local_60[0] == 0) {
                anon_unknown_4::SetNonBlock(iVar1,false);
                iVar5 = local_64;
                unaff_EBP = iVar1;
              }
              bVar8 = iVar2 == 0;
              local_64 = iVar5;
            }
          }
        }
      }
      if (bVar8) break;
      paVar6 = paVar6->ai_next;
      bVar7 = paVar6 == (addrinfo *)0x0;
    } while (!bVar7);
  }
  if (!bVar7) {
    return unaff_EBP;
  }
  this = (system_error *)__cxa_allocate_exception(0x20);
  if (local_64 < 1) {
    piVar3 = __errno_location();
    iVar1 = *piVar3;
    peVar4 = (error_category *)std::_V2::system_category();
    std::system_error::system_error(this,iVar1,peVar4,"fail to connect");
  }
  else {
    peVar4 = (error_category *)std::_V2::system_category();
    std::system_error::system_error(this,local_64,peVar4,"fail to connect");
  }
LAB_00134691:
  __cxa_throw(this,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

SOCKET SocketConnect(const NetworkAddress& addr, const std::optional<SocketTimeoutParams>& socket_timeout_params) {
    int last_err = 0;
    for (auto res = addr.Info(); res != nullptr; res = res->ai_next) {
        SOCKET s(socket(res->ai_family, res->ai_socktype, res->ai_protocol));

        if (s == -1) {
            continue;
        }

        SetNonBlock(s, true);
        if(socket_timeout_params) {
            SetTimeout(s, *socket_timeout_params);
        }

        if (connect(s, res->ai_addr, (int)res->ai_addrlen) != 0) {
            int err = errno;
            if (err == EINPROGRESS || err == EAGAIN || err == EWOULDBLOCK) {
                pollfd fd;
                fd.fd = s;
                fd.events = POLLOUT;
                fd.revents = 0;
                ssize_t rval = Poll(&fd, 1, 5000);

                if (rval == -1) {
                    throw std::system_error(errno, std::system_category(), "fail to connect");
                }
                if (rval > 0) {
                    socklen_t len = sizeof(err);
                    getsockopt(s, SOL_SOCKET, SO_ERROR, (char*)&err, &len);

                    if (!err) {
                        SetNonBlock(s, false);
                        return s;
                    }
                   last_err = err;
                }
            }
        } else {
            SetNonBlock(s, false);
            return s;
        }
    }
    if (last_err > 0) {
        throw std::system_error(last_err, std::system_category(), "fail to connect");
    }
    throw std::system_error(
        errno, std::system_category(), "fail to connect"
    );
}